

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfadop.h
# Opt level: O0

value_type __thiscall
TFadBinaryDiv<TFad<6,_double>,_TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>_>
::dx(TFadBinaryDiv<TFad<6,_double>,_TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double *pdVar2;
  int in_ESI;
  undefined8 *in_RDI;
  double dVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  int in_stack_ffffffffffffffbc;
  TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  dVar3 = TFad<6,_double>::dx((TFad<6,_double> *)*in_RDI,in_ESI);
  vVar4 = TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
          ::val((TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
                 *)0x14e7c37);
  vVar5 = TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
          ::dx(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pdVar2 = TFad<6,_double>::val((TFad<6,_double> *)*in_RDI);
  dVar1 = *pdVar2;
  vVar6 = TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
          ::val((TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
                 *)0x14e7cae);
  vVar7 = TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
          ::val((TFadExpr<TFadFuncSqrt<TFadExpr<TFadBinaryAdd<TFad<6,_double>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>_>_>
                 *)0x14e7cc2);
  return (dVar3 * vVar4 + -(vVar5 * dVar1)) / (vVar6 * vVar7);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}